

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTessellationTests.cpp
# Opt level: O0

ProgramSources *
deqp::gles31::Functional::NegativeTestShared::makeTessPipelineSources
          (ProgramSources *__return_storage_ptr__,string *vertexSrc,string *fragmentSrc,
          string *tessCtrlSrc,string *tessEvalSrc)

{
  ulong uVar1;
  string *tessEvalSrc_local;
  string *tessCtrlSrc_local;
  string *fragmentSrc_local;
  string *vertexSrc_local;
  ProgramSources *sources;
  
  glu::ProgramSources::ProgramSources(__return_storage_ptr__);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__->sources,vertexSrc);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__->sources + 1,fragmentSrc);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__->sources + 3,tessCtrlSrc);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__->sources + 4,tessEvalSrc);
  }
  return __return_storage_ptr__;
}

Assistant:

static glu::ProgramSources makeTessPipelineSources (const std::string& vertexSrc, const std::string& fragmentSrc, const std::string& tessCtrlSrc, const std::string& tessEvalSrc)
{
	glu::ProgramSources sources;
	sources.sources[glu::SHADERTYPE_VERTEX].push_back(vertexSrc);
	sources.sources[glu::SHADERTYPE_FRAGMENT].push_back(fragmentSrc);

	if (!tessCtrlSrc.empty())
		sources.sources[glu::SHADERTYPE_TESSELLATION_CONTROL].push_back(tessCtrlSrc);

	if (!tessEvalSrc.empty())
		sources.sources[glu::SHADERTYPE_TESSELLATION_EVALUATION].push_back(tessEvalSrc);

	return sources;
}